

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_set_condexec(DisasContext_conflict1 *s)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *s_00;
  TCGTemp *ts;
  
  iVar1 = s->condexec_mask;
  if (iVar1 != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar2 = s->condexec_cond;
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    tcg_gen_op2_aarch64(s_00,INDEX_op_movi_i32,(TCGArg)ts,(long)(iVar1 >> 1 | iVar2 << 4));
    tcg_gen_op3_aarch64(s_00,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0x224);
    tcg_temp_free_internal_aarch64(s_00,ts);
    return;
  }
  return;
}

Assistant:

static inline void gen_set_condexec(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->condexec_mask) {
        uint32_t val = (s->condexec_cond << 4) | (s->condexec_mask >> 1);
        TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_movi_i32(tcg_ctx, tmp, val);
        store_cpu_field(tcg_ctx, tmp, condexec_bits);
    }
}